

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

double __thiscall ddd::DictionarySGL<true,_true>::ratio_singles(DictionarySGL<true,_true> *this)

{
  uint32_t uVar1;
  DaTrie<true,_true,_false> *this_00;
  DaTrie<true,_true,_false> *unaff_retaddr;
  
  std::
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                *)0x16597b);
  uVar1 = DaTrie<true,_true,_false>::num_singles(unaff_retaddr);
  this_00 = (DaTrie<true,_true,_false> *)(double)uVar1;
  std::
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                *)0x165999);
  uVar1 = DaTrie<true,_true,_false>::num_nodes(this_00);
  return (double)this_00 / (double)uVar1;
}

Assistant:

double ratio_singles() const { // not in constant time
    return static_cast<double>(trie_->num_singles()) / trie_->num_nodes();
  }